

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnElemDrop(SharedValidator *this,Location *loc,Var *segment_var)

{
  Result RVar1;
  Result RVar2;
  Var VStack_68;
  
  this->expr_loc_ = loc;
  Var::Var(&VStack_68,segment_var);
  RVar1 = CheckElemSegmentIndex(this,&VStack_68,(ElemType *)0x0);
  Var::~Var(&VStack_68);
  if (segment_var->type_ == Index) {
    RVar2 = TypeChecker::OnElemDrop(&this->typechecker_,(segment_var->field_2).index_);
    RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
    RVar1.enum_._1_3_ = 0;
    return (Result)RVar1.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h",0x38
                ,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnElemDrop(const Location& loc, Var segment_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= CheckElemSegmentIndex(segment_var);
  result |= typechecker_.OnElemDrop(segment_var.index());
  return result;
}